

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

void __thiscall
soul::HTMLGenerator::printTOCNode
          (HTMLGenerator *this,HTMLElement *parent,TableOfContentsNode *node,bool isRoot)

{
  bool bVar1;
  HTMLElement *pHVar2;
  vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
  *this_00;
  reference node_00;
  string_view sVar3;
  TableOfContentsNode *n;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
  *__range3;
  allocator<char> local_169;
  string local_168;
  HTMLElement *local_148;
  HTMLElement *ul;
  char *local_138;
  string_view local_130;
  string_view local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string_view local_f0;
  string_view local_e0;
  File *local_d0;
  File *f;
  char *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string_view local_98;
  string_view local_88;
  Module *local_78;
  Module *m;
  allocator<char> local_59;
  string local_58;
  HTMLElement *local_38;
  HTMLElement *li;
  HTMLElement *p;
  TableOfContentsNode *pTStack_20;
  bool isRoot_local;
  TableOfContentsNode *node_local;
  HTMLElement *parent_local;
  HTMLGenerator *this_local;
  
  li = parent;
  p._7_1_ = isRoot;
  pTStack_20 = node;
  node_local = (TableOfContentsNode *)parent;
  parent_local = (HTMLElement *)this;
  if (!isRoot) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"li",&local_59);
    pHVar2 = choc::html::HTMLElement::addChild(parent,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    local_78 = pTStack_20->module;
    local_38 = pHVar2;
    if (local_78 == (Module *)0x0) {
      local_d0 = pTStack_20->file;
      if (local_d0 == (File *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_130,"toc_item");
        pHVar2 = choc::html::HTMLElement::setClass(pHVar2,local_130);
        sVar3 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_20);
        local_138 = sVar3._M_str;
        ul = (HTMLElement *)sVar3._M_len;
        choc::html::HTMLElement::addContent(pHVar2,sVar3);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_e0,"toc_module");
        pHVar2 = choc::html::HTMLElement::setClass(pHVar2,local_e0);
        std::operator+(&local_110,"#",&local_d0->UID);
        local_f0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_110);
        pHVar2 = choc::html::HTMLElement::addLink(pHVar2,local_f0);
        local_120 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_20);
        choc::html::HTMLElement::addContent(pHVar2,local_120);
        std::__cxx11::string::~string((string *)&local_110);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"toc_item")
      ;
      pHVar2 = choc::html::HTMLElement::setClass(pHVar2,local_88);
      std::operator+(&local_b8,"#",&local_78->UID);
      local_98 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b8);
      pHVar2 = choc::html::HTMLElement::addLink(pHVar2,local_98);
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_20);
      local_c0 = sVar3._M_str;
      f = (File *)sVar3._M_len;
      choc::html::HTMLElement::addContent(pHVar2,sVar3);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    li = local_38;
  }
  bVar1 = std::
          vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
          ::empty(&pTStack_20->children);
  pHVar2 = li;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"ul",&local_169);
    pHVar2 = choc::html::HTMLElement::addChild(pHVar2,&local_168);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"toc_item");
    pHVar2 = choc::html::HTMLElement::setClass(pHVar2,___range3);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    this_00 = &pTStack_20->children;
    local_148 = pHVar2;
    __end3 = std::
             vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
             ::begin(this_00);
    n = (TableOfContentsNode *)
        std::
        vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
                                  *)&n);
      if (!bVar1) break;
      node_00 = __gnu_cxx::
                __normal_iterator<const_soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
                ::operator*(&__end3);
      printTOCNode(this,local_148,node_00,false);
      __gnu_cxx::
      __normal_iterator<const_soul::SourceCodeModel::TableOfContentsNode_*,_std::vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void printTOCNode (choc::html::HTMLElement& parent, const SourceCodeModel::TableOfContentsNode& node, bool isRoot)
    {
        auto p = &parent;

        if (! isRoot)
        {
            auto& li = parent.addChild ("li");

            if (auto m = node.module)
                li.setClass ("toc_item").addLink ("#" + m->UID).addContent (node.name);
            else if (auto f = node.file)
                li.setClass ("toc_module").addLink ("#" + f->UID).addContent (node.name);
            else
                li.setClass ("toc_item").addContent (node.name);

            p = &li;
        }

        if (! node.children.empty())
        {
            auto& ul = p->addChild ("ul").setClass ("toc_item");

            for (auto& n : node.children)
                printTOCNode (ul, n, false);
        }
    }